

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configFileReader.cpp
# Opt level: O2

bool __thiscall configFileReader::isEOF(configFileReader *this)

{
  char cVar1;
  int iVar2;
  typeOfSeparator tVar3;
  int iVar4;
  bool bVar5;
  
  if (this->readFromString == true) {
    bVar5 = (this->text)._M_string_length <= (ulong)this->index;
  }
  else {
    openFile(this);
    bVar5 = true;
    if (*(int *)(this->configFile + *(long *)(*(long *)this->configFile + -0x18) + 0x20) == 0) {
      iVar4 = 1;
      iVar2 = 0;
      while (iVar2 == 0) {
        cVar1 = peekNextChar(this);
        tVar3 = isSeparator(this,cVar1);
        if (tVar3 != space) break;
        skipNextChar(this);
        cVar1 = peekNextChar(this);
        tVar3 = isSeparator(this,cVar1);
        if ((tVar3 != space) && (cVar1 = peekNextChar(this), cVar1 != -1)) {
          while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
            std::istream::unget();
          }
          return false;
        }
        iVar4 = iVar4 + 1;
        iVar2 = *(int *)(this->configFile + *(long *)(*(long *)this->configFile + -0x18) + 0x20);
      }
      cVar1 = peekNextChar(this);
      bVar5 = cVar1 == -1;
    }
  }
  return bVar5;
}

Assistant:

bool configFileReader::isEOF() {
    if (readFromString) {
        return index >= text.length();
    } else {
        openFile();
        if ((configFile->rdstate() && ios::eofbit) || (configFile->rdstate() && ios::failbit)) {
            return true;
        }
        int count = 0;
        while (!(configFile->rdstate() && ios::eofbit) && !(configFile->rdstate() && ios::failbit) &&
               isSeparator(peekNextChar()) == typeOfSeparator::space) {
            skipNextChar();
            count++;
            if (isSeparator(peekNextChar()) != typeOfSeparator::space && peekNextChar() != -1) {
                for (int i = 0; i < count; i++) {
                    configFile->unget();
                }
                return false;
            }
        }
        if (peekNextChar() != -1)
            return false;
        return true;
    }
}